

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpendableAppearance.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::ExpendableAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ExpendableAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KINT32 Value_03;
  KStringStream ss;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Expendable Appearance:",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Damage:               ",0x16);
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Is Smoke Emanating:   ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Parachute Status:     ",0x16);
  ENUMS::GetEnumAsStringParachute_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)((uint)*this >> 7 & 3),Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Flare/Smoke Color:    ",0x16);
  ENUMS::GetEnumAsStringFlareSmokeColor_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)((uint)*this >> 9 & 7),Value_01);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Flaming Effect:       ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Launch Flash:         ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Flare/Smoke Status:   ",0x16);
  ENUMS::GetEnumAsStringFlareSmokeStatus_abi_cxx11_
            (&local_220,(ENUMS *)(ulong)((uint)*this >> 0x11 & 3),Value_02);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Frozen Status:        ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Power Plant Status:   ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"State:                ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Spot Chaff Status:    ",0x16);
  ENUMS::GetEnumAsStringSpotChaff_abi_cxx11_
            (&local_240,(ENUMS *)(ulong)((byte)this->field_0x3 & 3),Value_03);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Masked/Cloaked:       ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString ExpendableAppearance::GetAsString() const
{
    KStringStream ss;

    ss <<            "Expendable Appearance:"
       << sRetTab << "Damage:               " << GetEnumAsStringEntityDamage( m_Damage )
       << sRetTab << "Is Smoke Emanating:   " << m_Smoke
       << sRetTab << "Parachute Status:     " << GetEnumAsStringParachute( m_ParachuteStatus )
       << sRetTab << "Flare/Smoke Color:    " << GetEnumAsStringFlareSmokeColor( m_FlareSmokeColor )
       << sRetTab << "Flaming Effect:       " << m_FlamingEffectField
       << sRetTab << "Launch Flash:         " << m_LaunchFlash
       << sRetTab << "Flare/Smoke Status:   " << GetEnumAsStringFlareSmokeStatus( m_FlareSmokeStatus )
       << sRetTab << "Frozen Status:        " << m_FrozenStatus
       << sRetTab << "Power Plant Status:   " << m_PowerPlantStatus
       << sRetTab << "State:                " << m_State
       << sRetTab << "Spot Chaff Status:    " << GetEnumAsStringSpotChaff( m_SpotChaffStatus )
       << sRetTab << "Masked/Cloaked:       " << m_MaskedCloaked
       << sRetTab;

    return ss.str();
}